

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmainfo.c
# Opt level: O3

char * vma_info(void *ptr)

{
  char *pcVar1;
  int iVar2;
  char *__s;
  FILE *__stream;
  __ssize_t _Var3;
  size_t sVar4;
  char *pcVar5;
  void *__ptr;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  void *pvVar9;
  char *line;
  size_t line_n;
  unsigned_long b;
  unsigned_long a;
  char *local_68;
  size_t local_60;
  void *local_58;
  ulong local_50;
  FILE *local_48;
  void *local_40;
  void *local_38;
  
  local_68 = (char *)0x0;
  local_60 = 0;
  __s = (char *)malloc(0x800);
  if (__s == (char *)0x0) {
    return (char *)0x0;
  }
  *__s = '\0';
  __stream = fopen("/proc/self/smaps","r");
  if (__stream == (FILE *)0x0) {
    return __s;
  }
  _Var3 = getline(&local_68,&local_60,__stream);
  if (_Var3 == -1) {
    __ptr = (void *)0x0;
  }
  else {
    uVar7 = 0;
    __ptr = (void *)0x0;
    local_58 = ptr;
    do {
      iVar2 = __isoc99_sscanf(local_68,"%lx-%lx",&local_38,&local_40);
      if (((iVar2 == 2) && (local_38 <= local_58)) && (local_58 < local_40)) {
        sVar4 = strlen(__s);
        builtin_strncpy(__s + sVar4,"    ",5);
        strcat(__s,local_68);
        _Var3 = getline(&local_68,&local_60,__stream);
        pvVar9 = __ptr;
        if (_Var3 == -1) goto LAB_0024ee35;
        do {
          pcVar1 = local_68;
          if ((0x19 < (byte)(*local_68 + 0xbfU)) ||
             (pcVar5 = strchr(local_68,0x3a), pcVar5 == (char *)0x0)) {
            free(pcVar1);
LAB_0024ee6d:
            uVar8 = (ulong)uVar7;
            __ptr = pvVar9;
            goto LAB_0024ee73;
          }
          uVar8 = (ulong)(uVar7 + 1);
          __ptr = realloc(pvVar9,uVar8 * 8);
          if (__ptr == (void *)0x0) goto LAB_0024ee6d;
          *(char **)((long)__ptr + (ulong)uVar7 * 8) = local_68;
          local_68 = (char *)0x0;
          local_60 = 0;
          _Var3 = getline(&local_68,&local_60,__stream);
          pvVar9 = __ptr;
          uVar7 = uVar7 + 1;
        } while (_Var3 != -1);
      }
      else {
LAB_0024ee35:
        uVar8 = (ulong)uVar7;
      }
      _Var3 = getline(&local_68,&local_60,__stream);
      uVar7 = (uint)uVar8;
    } while (_Var3 != -1);
LAB_0024ee73:
    uVar6 = uVar8 >> 1;
    if (1 < (uint)uVar8) {
      local_58 = (void *)(uVar6 * 8);
      pvVar9 = (void *)0x0;
      local_50 = uVar8;
      local_48 = __stream;
      do {
        pcVar1 = *(char **)((long)__ptr + (long)pvVar9);
        sVar4 = strlen(pcVar1);
        pcVar1[sVar4 - 1] = '\0';
        sVar4 = strlen(__s);
        builtin_strncpy(__s + sVar4,"    ",5);
        strcat(__s,*(char **)((long)__ptr + (long)pvVar9));
        sVar4 = strlen(__s);
        builtin_strncpy(__s + sVar4,"  |  ",6);
        strcat(__s,*(char **)((long)__ptr + uVar6 * 8));
        uVar6 = uVar6 + 1;
        pvVar9 = (void *)((long)pvVar9 + 8);
        uVar8 = local_50;
        __stream = local_48;
      } while (local_58 != pvVar9);
    }
    if ((uint)uVar6 < (uint)uVar8) {
      sVar4 = strlen(__s);
      builtin_strncpy(__s + sVar4,"    ",5);
      strcat(__s,*(char **)((long)__ptr + (uVar6 & 0xffffffff) * 8));
    }
    else if ((uint)uVar8 == 0) goto LAB_0024ef57;
    uVar6 = 0;
    do {
      free(*(void **)((long)__ptr + uVar6 * 8));
      uVar6 = uVar6 + 1;
    } while ((uVar8 & 0xffffffff) != uVar6);
  }
LAB_0024ef57:
  free(__ptr);
  fclose(__stream);
  return __s;
}

Assistant:

char *
vma_info(void *ptr)
{
	FILE *fp = NULL;
	char *buf = NULL;
	char *line = NULL;
	char **pairs = NULL, **tmp = NULL;
	unsigned pairs_cnt = 0;
	size_t line_n = 0;
	buf = malloc(2048);
	if (!buf)
		goto done;
	buf[0] = 0;
	fp = fopen("/proc/self/smaps", "r");
	if (!fp)
		goto done;
	while (getline(&line, &line_n, fp) != -1) {
		unsigned long a, b;
		if (sscanf(line, "%lx-%lx", &a, &b) != 2)
			continue;
		if (a <= (unsigned long)ptr && (unsigned long)ptr < b) {
			/* OK, found it! */
			strcat(buf, "    ");
			strcat(buf, line);
			while (getline(&line, &line_n, fp) != -1) {
				if (line[0] >= 'A' && line[0] <= 'Z'
						&& strchr(line, ':') != NULL) {
					tmp = realloc(pairs, (pairs_cnt+1) * sizeof(char *));
					if (!tmp)
						goto done;
					pairs = tmp;
					pairs[pairs_cnt++] = line;
					line = NULL;
					line_n = 0;
				} else {
					free(line);
					goto done;
				}
			}
		}
	}
done:
	add_smaps(buf, pairs, pairs_cnt);
	free_pairs(pairs, pairs_cnt);
	if (fp)
		fclose(fp);
	return buf;
}